

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O1

void __thiscall
TxRequestTracker::Impl::ReceivedInv
          (Impl *this,NodeId peer,GenTxid *gtxid,bool preferred,microseconds reqtime)

{
  uint256 *__u;
  type *ptVar1;
  size_type *psVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  weak_ordering wVar11;
  _Head_base<2UL,_unsigned_long,_false> ann;
  mapped_type *pmVar12;
  ulong uVar13;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar14;
  _Head_base<2UL,_unsigned_long,_false> _Var15;
  ulong uVar16;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar17;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar18;
  long in_FS_OFFSET;
  bool bVar19;
  link_info inf;
  link_info inf_2;
  link_info inf_1;
  uint256 *local_88;
  uint local_80;
  long local_78;
  result_type local_70;
  uint local_58 [4];
  int local_48 [2];
  rep local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __u = &gtxid->m_hash;
  poVar17 = (this->m_index).
            super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
            .member;
  uVar13 = (poVar17->
           super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           ).
           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .
           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .super_type.parentcolor_ & 0xfffffffffffffffe;
  local_88 = (uint256 *)peer;
  do {
    while( true ) {
      uVar16 = uVar13;
      poVar14 = poVar17;
      poVar18 = poVar14;
      if (uVar16 == 0) goto LAB_003f7708;
      poVar17 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 *)(uVar16 - 0x68);
      wVar11._M_value = -(*(long *)(uVar16 - 0x40) < peer) | 1;
      if (*(long *)(uVar16 - 0x40) == peer) {
        bVar19 = (*(ulong *)(uVar16 - 0x38) & 0xe000000000000000) == 0x4000000000000000;
        if (bVar19) {
          wVar11 = std::__detail::_Synth3way::operator()<uint256,_uint256>
                             ((_Synth3way *)&std::__detail::__synth3way,(uint256 *)poVar17,__u);
        }
        else {
          wVar11._M_value = -!bVar19;
        }
      }
      if (-1 < wVar11._M_value) break;
      poVar17 = poVar14;
      uVar13 = *(ulong *)(uVar16 + 0x10);
    }
    wVar11._M_value = -(peer < *(long *)(uVar16 - 0x40)) | 1;
    if ((*(long *)(uVar16 - 0x40) == peer) &&
       (wVar11._M_value = (*(ulong *)(uVar16 - 0x38) & 0xe000000000000000) != 0x4000000000000000,
       !(bool)wVar11._M_value)) {
      wVar11 = std::__detail::_Synth3way::operator()<uint256,_uint256>
                         ((_Synth3way *)&std::__detail::__synth3way,__u,(uint256 *)poVar17);
    }
    uVar13 = *(ulong *)(uVar16 + 8);
  } while (wVar11._M_value < '\0');
  for (; uVar13 != 0; uVar13 = *(ulong *)(uVar13 + 8 + (ulong)((byte)wVar11._M_value >> 7) * 8)) {
    wVar11._M_value = -(*(long *)(uVar13 - 0x40) < peer) | 1;
    if (*(long *)(uVar13 - 0x40) == peer) {
      bVar19 = (*(ulong *)(uVar13 - 0x38) & 0xe000000000000000) == 0x4000000000000000;
      if (bVar19) {
        wVar11 = std::__detail::_Synth3way::operator()<uint256,_uint256>
                           ((_Synth3way *)&std::__detail::__synth3way,(uint256 *)(uVar13 - 0x68),__u
                           );
      }
      else {
        wVar11._M_value = -!bVar19;
      }
    }
    if (-1 < wVar11._M_value) {
      poVar17 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 *)(uVar13 - 0x68);
    }
  }
  for (lVar3 = *(long *)(uVar16 + 0x10); poVar14 = poVar17, lVar3 != 0;
      lVar3 = *(long *)(lVar3 + 8 + (ulong)(-1 < wVar11._M_value) * 8)) {
    wVar11._M_value = -(peer < *(long *)(lVar3 + -0x40)) | 1;
    if ((*(long *)(lVar3 + -0x40) == peer) &&
       (wVar11._M_value = (*(ulong *)(lVar3 + -0x38) & 0xe000000000000000) != 0x4000000000000000,
       !(bool)wVar11._M_value)) {
      wVar11 = std::__detail::_Synth3way::operator()<uint256,_uint256>
                         ((_Synth3way *)&std::__detail::__synth3way,__u,(uint256 *)(lVar3 + -0x68));
    }
    if (-1 >= wVar11._M_value) {
      poVar18 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 *)(lVar3 + -0x68);
    }
  }
LAB_003f7708:
  if (poVar14 != poVar18) {
    poVar17 = poVar14;
    do {
      local_70.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
      super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
      super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl
           = (_Head_base<2UL,_unsigned_long,_false>)
             &poVar17->
              super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
      ;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)&local_70);
      poVar17 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 *)((long)local_70.
                          super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>
                          .super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
                          super__Tuple_impl<2UL,_unsigned_long>.
                          super__Head_base<2UL,_unsigned_long,_false>._M_head_impl + -0x68);
      if (local_70.
          super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
          super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
          super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
          _M_head_impl == 0) {
        poVar17 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                   *)0x0;
      }
    } while (poVar17 != poVar18);
    if (poVar14 != poVar18) goto LAB_003f7908;
  }
  ptVar1 = &(this->m_index).super_type;
  ann._M_head_impl = (unsigned_long)operator_new(0x80);
  uVar4 = *(undefined4 *)(__u->super_base_blob<256U>).m_data._M_elems;
  uVar5 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 4);
  uVar6 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 8);
  uVar7 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0xc);
  uVar8 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x14);
  uVar9 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x18);
  uVar10 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x1c);
  uVar13 = this->m_current_sequence;
  *(undefined4 *)(ann._M_head_impl + 0x10) =
       *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined4 *)(ann._M_head_impl + 0x14) = uVar8;
  *(undefined4 *)(ann._M_head_impl + 0x18) = uVar9;
  *(undefined4 *)(ann._M_head_impl + 0x1c) = uVar10;
  *(undefined4 *)ann._M_head_impl = uVar4;
  *(undefined4 *)(ann._M_head_impl + 4) = uVar5;
  *(undefined4 *)(ann._M_head_impl + 8) = uVar6;
  *(undefined4 *)(ann._M_head_impl + 0xc) = uVar7;
  ((microseconds *)(ann._M_head_impl + 0x20))->__r = reqtime.__r;
  *(uint256 **)(ann._M_head_impl + 0x28) = local_88;
  uVar13 = uVar13 & 0x7ffffffffffffff;
  uVar16 = 0;
  if (preferred) {
    uVar16 = 0x800000000000000;
  }
  *(ulong *)(ann._M_head_impl + 0x30) =
       *(ulong *)(ann._M_head_impl + 0x30) & 0xf000000000000000 | uVar16 | uVar13;
  *(ulong *)(ann._M_head_impl + 0x30) = (ulong)gtxid->m_is_wtxid << 0x3c | uVar16 | uVar13;
  local_80 = 0;
  local_70.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Head_base<1UL,_(anonymous_namespace)::State,_false>._M_head_impl = CANDIDATE_DELAYED;
  local_70.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Head_base<0UL,_const_uint256_&,_false>._M_head_impl = local_88;
  local_70.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<2UL,_unsigned_long,_false>)
       (_Head_base<2UL,_unsigned_long,_false>)ann._M_head_impl;
  bVar19 = boost::multi_index::detail::
           ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
           ::link_point(&ptVar1->super_type);
  if (bVar19) {
    local_58[0] = 0;
    anon_unknown.dwarf_121ee0c::ByTxHashViewExtractor::operator()
              (&local_70,(ByTxHashViewExtractor *)&(this->m_index).super_type.super_type.field_0x8,
               (Announcement *)ann._M_head_impl);
    boost::multi_index::detail::
    ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
    ::link_point((ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                  *)ptVar1,&local_70,local_58);
    uVar13 = *(ulong *)(ann._M_head_impl + 0x30) >> 0x3d;
    local_48[0] = (uVar13 - 1 < 2) + 1;
    if (uVar13 == 3) {
      local_48[0] = 0;
    }
    local_70.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<2UL,_unsigned_long,_false>)
         ((ulong)local_70.
                 super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>
                 .super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
                 super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
                 _M_head_impl & 0xffffffff00000000);
    if (uVar13 == 0) {
      local_48[0] = 0;
    }
    local_40 = ((microseconds *)(ann._M_head_impl + 0x20))->__r;
    boost::multi_index::detail::
    ordered_index_impl<(anonymous_namespace)::ByTimeViewExtractor,_std::less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>,_boost::multi_index::detail::nth_layer<3,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTime,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
    ::link_point((ordered_index_impl<(anonymous_namespace)::ByTimeViewExtractor,_std::less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>,_boost::multi_index::detail::nth_layer<3,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTime,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                  *)ptVar1,local_48,&local_70);
    boost::multi_index::detail::
    ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
    ::link((char *)(ann._M_head_impl + 0x38),
           (char *)((ulong)local_70.
                           super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>
                           .super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
                           super__Tuple_impl<2UL,_unsigned_long>.
                           super__Head_base<2UL,_unsigned_long,_false>._M_head_impl & 0xffffffff));
    boost::multi_index::detail::
    ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
    ::link((char *)(ann._M_head_impl + 0x50),(char *)(ulong)local_58[0]);
    boost::multi_index::detail::
    ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
    ::link((char *)(ann._M_head_impl + 0x68),(char *)(ulong)local_80);
    _Var15._M_head_impl = ann._M_head_impl;
  }
  else {
    _Var15._M_head_impl = local_78 + -0x68;
    if (local_78 == 0) {
      _Var15._M_head_impl = 0;
    }
  }
  if (_Var15._M_head_impl == ann._M_head_impl) {
    psVar2 = &(this->m_index).node_count;
    *psVar2 = *psVar2 + 1;
    pmVar12 = std::
              unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
              ::operator[](&this->m_peerinfo,(key_type *)&local_88);
    pmVar12->m_total = pmVar12->m_total + 1;
    this->m_current_sequence = this->m_current_sequence + 1;
  }
  else {
    operator_delete((void *)ann._M_head_impl,0x80);
  }
LAB_003f7908:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReceivedInv(NodeId peer, const GenTxid& gtxid, bool preferred,
        std::chrono::microseconds reqtime)
    {
        // Bail out if we already have a CANDIDATE_BEST announcement for this (txhash, peer) combination. The case
        // where there is a non-CANDIDATE_BEST announcement already will be caught by the uniqueness property of the
        // ByPeer index when we try to emplace the new object below.
        if (m_index.get<ByPeer>().count(ByPeerView{peer, true, gtxid.GetHash()})) return;

        // Try creating the announcement with CANDIDATE_DELAYED state (which will fail due to the uniqueness
        // of the ByPeer index if a non-CANDIDATE_BEST announcement already exists with the same txhash and peer).
        // Bail out in that case.
        auto ret = m_index.get<ByPeer>().emplace(gtxid, peer, preferred, reqtime, m_current_sequence);
        if (!ret.second) return;

        // Update accounting metadata.
        ++m_peerinfo[peer].m_total;
        ++m_current_sequence;
    }